

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall
PermutationElement_UniformDelta_Test::TestBody(PermutationElement_UniformDelta_Test *this)

{
  int iVar1;
  uint64_t uVar2;
  uint uVar3;
  uint32_t l;
  uint32_t i;
  int *args_2;
  int iVar4;
  uint64_t v;
  long lVar5;
  int *args_4;
  int n;
  int local_cc;
  uint local_c8;
  int local_c4;
  ulong local_c0;
  float local_b8;
  int local_b4;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  long local_98;
  AssertHelper local_90;
  vector<int,_std::allocator<int>_> count;
  int vb;
  undefined4 uStack_6c;
  int va;
  
  local_98 = 0;
  do {
    if (local_98 == 0x28) {
      return;
    }
    n = *(int *)((long)&DAT_0052a170 + local_98);
    std::vector<int,_std::allocator<int>_>::vector
              (&count,(ulong)(uint)(n * n),(allocator_type *)&va);
    v = 0;
    local_c8 = n * 60000;
    local_c0 = (ulong)(~((int)local_c8 >> 0x1f) & local_c8);
    l = n;
    while( true ) {
      if (v == local_c0) break;
      iVar4 = 0;
      for (i = 0; (int)i < (int)l; i = i + 1) {
        uVar2 = pbrt::MixBits(v);
        iVar1 = pbrt::PermutationElement(i,l,(uint32_t)uVar2);
        vb = n;
        uVar3 = iVar1 + iVar4 >> 0x1f & n;
        va = iVar1 + iVar4 + uVar3;
        if (n <= va) {
          pbrt::
          LogFatal<char_const(&)[6],char_const(&)[2],char_const(&)[6],int&,char_const(&)[2],int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                     ,0x3b3,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])0x2df94cf,
                     (char (*) [2])0x52b4ed,(char (*) [6])0x2df94cf,&va,(char (*) [2])0x52b4ed,&vb);
        }
        iVar1 = uVar3 + iVar1 + iVar4;
        iVar4 = iVar4 + -1;
        count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [(int)(n * iVar1 + i)] =
             count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[(int)(n * iVar1 + i)] + 1;
        l = n;
      }
      v = v + 1;
    }
    local_b8 = (float)(int)local_c8 * 1.03;
    local_c0 = CONCAT44(local_c0._4_4_,(float)(int)local_c8 * 0.97);
    for (local_cc = 0; local_cc < (int)l; local_cc = local_cc + 1) {
      for (local_c4 = 0; local_c4 < (int)l; local_c4 = local_c4 + 1) {
        lVar5 = (long)(int)(local_c4 * l) + (long)local_cc;
        if ((float)local_c0 / (float)(int)l <=
            (float)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5]) {
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar_.success_ =
               (float)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5] <= local_b8 / (float)(int)l;
          if (!gtest_ar_.success_) goto LAB_00333d34;
        }
        else {
          gtest_ar_.success_ = false;
LAB_00333d34:
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          args_4 = (int *)0x333d3c;
          testing::Message::Message((Message *)&local_a0);
          local_b4 = (int)local_c8 / n;
          args_2 = &n;
          pbrt::StringPrintf<int&,int&,int&,int&,int>
                    ((string *)&va,
                     (pbrt *)"Got count %d for %d -> %d (perm size %d). Expected +/- %d.\n",
                     (char *)(count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar5),&local_cc,&local_c4,args_2,
                     &local_b4,args_4);
          std::operator<<((ostream *)(local_a0.ptr_ + 0x10),(string *)&va);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&vb,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "count[offset] >= (1 - tol) * numIters / n && count[offset] <=(1 + tol) * numIters / n"
                     ,"false","true",(char *)args_2);
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                     ,0x3be,(char *)CONCAT44(uStack_6c,vb));
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          std::__cxx11::string::~string((string *)&vb);
          std::__cxx11::string::~string((string *)&va);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_a0);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        l = n;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&count.super__Vector_base<int,_std::allocator<int>_>);
    local_98 = local_98 + 4;
  } while( true );
}

Assistant:

TEST(PermutationElement, UniformDelta) {
    for (int n : { 2, 3, 4, 5, 9, 14, 16, 22, 27, 36 }) {
        std::vector<int> count(n * n);

        int numIters = 60000 * n;
        for (int seed = 0; seed < numIters; ++seed) {
            for (int i = 0; i < n; ++i) {
                int ip = PermutationElement(i, n, MixBits(seed));
                int delta = ip - i;
                if (delta < 0) delta += n;
                CHECK_LT(delta, n);
                int offset = delta * n + i;
                ++count[offset];
            }
        }

        for (int i = 0; i < n; ++i) {
            for (int j = 0; j < n; ++j) {
                Float tol = 0.03f;
                int offset = j * n + i;
                EXPECT_TRUE(count[offset] >= (1 - tol) * numIters / n &&
                            count[offset] <=(1 + tol) * numIters / n) <<
                StringPrintf("Got count %d for %d -> %d (perm size %d). Expected +/- %d.\n",
                                 count[offset], i, j, n, numIters / n);
            }
        }
    }
}